

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

void __thiscall TiXmlAttribute::Print(TiXmlAttribute *this,FILE *cfile,int param_2,TiXmlString *str)

{
  char cVar1;
  Rep *pRVar2;
  char *extraout_RAX;
  char *pcVar3;
  bool bVar4;
  TiXmlString v;
  TiXmlString n;
  TiXmlString local_28;
  TiXmlString local_20;
  
  local_20.rep_ = &TiXmlString::nullrep_;
  local_28.rep_ = &TiXmlString::nullrep_;
  TiXmlBase::EncodeString(&this->name,&local_20);
  TiXmlBase::EncodeString(&this->value,&local_28);
  pRVar2 = (this->value).rep_;
  if (pRVar2->size == 0) {
LAB_00180d24:
    pcVar3 = (char *)0xffffffffffffffff;
  }
  else {
    cVar1 = pRVar2->str[0];
    bVar4 = cVar1 == '\0';
    pcVar3 = extraout_RAX;
    if (!bVar4) {
      pcVar3 = pRVar2->str;
      while (cVar1 != '\"') {
        cVar1 = pcVar3[1];
        bVar4 = cVar1 == '\0';
        if (bVar4) goto LAB_00180d20;
        pcVar3 = pcVar3 + 1;
      }
      pcVar3 = pcVar3 + -(long)pRVar2->str;
      bVar4 = false;
    }
LAB_00180d20:
    if (bVar4) goto LAB_00180d24;
  }
  if (pcVar3 == (char *)0xffffffffffffffff) {
    if (cfile != (FILE *)0x0) {
      fprintf((FILE *)cfile,"%s=\"%s\"",(local_20.rep_)->str,(local_28.rep_)->str);
    }
    if (str == (TiXmlString *)0x0) goto LAB_00180e29;
    TiXmlString::append(str,(local_20.rep_)->str,(local_20.rep_)->size);
    TiXmlString::append(str,"=\"",2);
    TiXmlString::append(str,(local_28.rep_)->str,(local_28.rep_)->size);
    pcVar3 = "\"";
  }
  else {
    if (cfile != (FILE *)0x0) {
      fprintf((FILE *)cfile,"%s=\'%s\'",(local_20.rep_)->str,(local_28.rep_)->str);
    }
    if (str == (TiXmlString *)0x0) goto LAB_00180e29;
    TiXmlString::append(str,(local_20.rep_)->str,(local_20.rep_)->size);
    TiXmlString::append(str,"=\'",2);
    TiXmlString::append(str,(local_28.rep_)->str,(local_28.rep_)->size);
    pcVar3 = "\'";
  }
  TiXmlString::append(str,pcVar3,1);
LAB_00180e29:
  if (local_28.rep_ != (Rep *)0x0 && local_28.rep_ != &TiXmlString::nullrep_) {
    operator_delete__(local_28.rep_);
  }
  if (local_20.rep_ != (Rep *)0x0 && local_20.rep_ != &TiXmlString::nullrep_) {
    operator_delete__(local_20.rep_);
  }
  return;
}

Assistant:

void TiXmlAttribute::Print( FILE* cfile, int /*depth*/, TIXML_STRING* str ) const
{
	TIXML_STRING n, v;

	EncodeString( name, &n );
	EncodeString( value, &v );

	if (value.find ('\"') == TIXML_STRING::npos) {
		if ( cfile ) {
			fprintf (cfile, "%s=\"%s\"", n.c_str(), v.c_str() );
		}
		if ( str ) {
			(*str) += n; (*str) += "=\""; (*str) += v; (*str) += "\"";
		}
	}
	else {
		if ( cfile ) {
			fprintf (cfile, "%s='%s'", n.c_str(), v.c_str() );
		}
		if ( str ) {
			(*str) += n; (*str) += "='"; (*str) += v; (*str) += "'";
		}
	}
}